

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

shared_ptr<pbrt::Object> __thiscall
pbrt::BinaryReader::getEntity<pbrt::Object>(BinaryReader *this,int ID)

{
  bool bVar1;
  __shared_ptr *this_00;
  runtime_error *this_01;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<pbrt::Object> sVar3;
  shared_ptr<pbrt::Object> *t;
  shared_ptr<pbrt::Entity> *in_stack_ffffffffffffffd8;
  
  if (in_EDX == -1) {
    std::shared_ptr<pbrt::Object>::shared_ptr((shared_ptr<pbrt::Object> *)0x2409aa);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
              ::operator[]((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
                            *)(in_RSI + 0x20),(long)in_EDX);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      std::vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>::
      operator[]((vector<std::shared_ptr<pbrt::Entity>,_std::allocator<std::shared_ptr<pbrt::Entity>_>_>
                  *)(in_RSI + 0x20),(long)in_EDX);
      std::dynamic_pointer_cast<pbrt::Object,pbrt::Entity>(in_stack_ffffffffffffffd8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
      _Var2._M_pi = extraout_RDX_01;
      if (!bVar1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,"error in reading binary file - given entity is not of expected type!");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::shared_ptr<pbrt::Object>::shared_ptr((shared_ptr<pbrt::Object> *)0x2409d8);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  sVar3.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  sVar3.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<pbrt::Object>)
         sVar3.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getEntity(int ID)
    {
      // rule 1: ID -1 is a valid identifier for 'null object'
      if (ID == -1)
        return std::shared_ptr<T>();
      // assertion: only values with ID 0 ... N-1 are allowed
      assert(ID < (int)readEntities.size() && ID >= 0);

      // rule 2: if object _was_ a null pointer, return it (that was
      // an error during object creation)
      if (!readEntities[ID])
        return std::shared_ptr<T>();

      std::shared_ptr<T> t = std::dynamic_pointer_cast<T>(readEntities[ID]);
      
      // rule 3: if object was of different type, throw an exception
      if (!t)
        throw std::runtime_error("error in reading binary file - given entity is not of expected type!");

      // rule 4: otherwise, return object cast to that type
      return t;
    }